

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editing_commands.cpp
# Opt level: O0

Am_Object get_undo_handler_from_cmd(Am_Object *cmd)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Object *in_RSI;
  Am_Object local_48;
  Am_Object local_40;
  undefined1 local_35;
  Am_Object local_28;
  Am_Object window;
  Am_Object widget;
  Am_Object *cmd_local;
  Am_Object *undo_handler;
  
  Am_Object::Am_Object(&window);
  Am_Object::Am_Object(&local_28);
  local_35 = 0;
  Am_Object::Am_Object(cmd);
  Am_Object::Am_Object(&local_48,in_RSI);
  Am_Get_Selection_Widget_For_Command(&local_40);
  Am_Object::operator=(&window,&local_40);
  Am_Object::~Am_Object(&local_40);
  Am_Object::~Am_Object(&local_48);
  bVar1 = Am_Object::Valid(&window);
  if (bVar1) {
    pAVar2 = Am_Object::Get(&window,0x68,0);
    Am_Object::operator=(&local_28,pAVar2);
  }
  bVar1 = Am_Object::Valid(&local_28);
  if (!bVar1) {
    pAVar2 = Am_Object::Get(in_RSI,0x170,0);
    Am_Object::operator=(&window,pAVar2);
    bVar1 = Am_Object::Valid(&window);
    if (bVar1) {
      pAVar2 = Am_Object::Get(&window,0x68,0);
      Am_Object::operator=(&local_28,pAVar2);
    }
  }
  bVar1 = Am_Object::Valid(&local_28);
  if (bVar1) {
    pAVar2 = Am_Object::Get(&local_28,0x174,0);
    Am_Object::operator=(cmd,pAVar2);
  }
  local_35 = 1;
  Am_Object::~Am_Object(&local_28);
  Am_Object::~Am_Object(&window);
  return (Am_Object)(Am_Object_Data *)cmd;
}

Assistant:

Am_Object
get_undo_handler_from_cmd(Am_Object cmd)
{
  Am_Object widget, window, undo_handler;
  widget = Am_Get_Selection_Widget_For_Command(cmd);
  if (widget.Valid())
    window = widget.Get(Am_WINDOW);
  if (!window.Valid()) {
    widget = cmd.Get(Am_SAVED_OLD_OWNER);
    if (widget.Valid())
      window = widget.Get(Am_WINDOW);
  }
  if (window.Valid())
    undo_handler = window.Get(Am_UNDO_HANDLER);
  return undo_handler;
}